

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhCellWriteHeader(lhcell *pCell)

{
  lhpage *plVar1;
  uchar *buf;
  uchar *zRaw;
  lhpage *pPage;
  lhcell *pCell_local;
  
  plVar1 = pCell->pPage;
  buf = plVar1->pRaw->zData + (int)(uint)pCell->iStart;
  SyBigEndianPack32(buf,pCell->nHash);
  SyBigEndianPack32(buf + 4,pCell->nKey);
  SyBigEndianPack64(buf + 8,pCell->nData);
  pCell->iNext = (plVar1->sHdr).iOfft;
  SyBigEndianPack16(buf + 0x10,pCell->iNext);
  SyBigEndianPack64(buf + 0x12,pCell->iOvfl);
  (plVar1->sHdr).iOfft = pCell->iStart;
  SyBigEndianPack16(plVar1->pRaw->zData,pCell->iStart);
  return 0;
}

Assistant:

static int lhCellWriteHeader(lhcell *pCell)
{
	lhpage *pPage = pCell->pPage;
	unsigned char *zRaw = pPage->pRaw->zData;
	/* Seek to the desired location */
	zRaw += pCell->iStart;
	/* 4 byte hash number */
	SyBigEndianPack32(zRaw,pCell->nHash);
	zRaw += 4;
	/* 4 byte key length */
	SyBigEndianPack32(zRaw,pCell->nKey);
	zRaw += 4;
	/* 8 byte data length */
	SyBigEndianPack64(zRaw,pCell->nData);
	zRaw += 8;
	/* 2 byte offset of the next cell */
	pCell->iNext = pPage->sHdr.iOfft;
	SyBigEndianPack16(zRaw,pCell->iNext);
	zRaw += 2;
	/* 8 byte overflow page number */
	SyBigEndianPack64(zRaw,pCell->iOvfl);
	/* Update the page header */
	pPage->sHdr.iOfft = pCell->iStart;
	/* pEngine->pIo->xWrite() has been successfully called on this page */
	SyBigEndianPack16(pPage->pRaw->zData,pCell->iStart);
	/* All done */
	return UNQLITE_OK;
}